

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

array_container_t * array_container_from_bitset(bitset_container_t *bits)

{
  uint64_t *puVar1;
  uint16_t *puVar2;
  long lVar3;
  array_container_t *paVar4;
  ushort uVar5;
  int iVar6;
  size_t i;
  long lVar7;
  uint64_t uVar8;
  uint16_t *puVar9;
  
  paVar4 = array_container_create_given_capacity(bits->cardinality);
  paVar4->cardinality = bits->cardinality;
  puVar1 = bits->words;
  puVar2 = paVar4->array;
  uVar5 = 0;
  iVar6 = 0;
  lVar7 = 0;
  do {
    uVar8 = puVar1[lVar7];
    if (uVar8 != 0) {
      puVar9 = puVar2 + iVar6;
      do {
        lVar3 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        *puVar9 = (ushort)lVar3 | uVar5;
        puVar9 = puVar9 + 1;
        iVar6 = iVar6 + 1;
        uVar8 = uVar8 & uVar8 - 1;
      } while (uVar8 != 0);
    }
    uVar5 = uVar5 + 0x40;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x400);
  return paVar4;
}

Assistant:

array_container_t *array_container_from_bitset(const bitset_container_t *bits) {
    array_container_t *result =
        array_container_create_given_capacity(bits->cardinality);
    result->cardinality = bits->cardinality;
    //  sse version ends up being slower here
    // (bitset_extract_setbits_sse_uint16)
    // because of the sparsity of the data
    bitset_extract_setbits_uint16(bits->words, BITSET_CONTAINER_SIZE_IN_WORDS,
                                  result->array, 0);
    return result;
}